

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred.c
# Opt level: O3

void aom_highbd_dc_left_predictor_32x8_c
               (uint16_t *dst,ptrdiff_t stride,uint16_t *above,uint16_t *left,int bd)

{
  uint16_t *puVar1;
  ulong uVar2;
  ulong uVar3;
  undefined1 auVar4 [14];
  undefined1 auVar5 [14];
  undefined1 auVar6 [14];
  undefined1 auVar7 [14];
  undefined1 auVar8 [14];
  undefined1 auVar9 [14];
  undefined1 auVar10 [14];
  int iVar11;
  long lVar12;
  undefined4 uVar13;
  undefined1 auVar14 [16];
  
  uVar2 = *(ulong *)left;
  auVar5._8_4_ = 0;
  auVar5._0_8_ = uVar2;
  auVar5._12_2_ = (short)(uVar2 >> 0x30);
  auVar7._8_2_ = (short)(uVar2 >> 0x20);
  auVar7._0_8_ = uVar2;
  auVar7._10_4_ = auVar5._10_4_;
  auVar9._6_8_ = 0;
  auVar9._0_6_ = auVar7._8_6_;
  uVar3 = *(ulong *)(left + 4);
  auVar4._8_4_ = 0;
  auVar4._0_8_ = uVar3;
  auVar4._12_2_ = (short)(uVar3 >> 0x30);
  auVar6._8_2_ = (short)(uVar3 >> 0x20);
  auVar6._0_8_ = uVar3;
  auVar6._10_4_ = auVar4._10_4_;
  auVar10._6_8_ = 0;
  auVar10._0_6_ = auVar6._8_6_;
  auVar8._4_2_ = (short)(uVar3 >> 0x10);
  auVar8._0_4_ = (uint)uVar3;
  auVar8._6_8_ = SUB148(auVar10 << 0x40,6);
  auVar14 = ZEXT416((auVar4._10_4_ >> 0x10) + (auVar5._10_4_ >> 0x10) +
                    auVar8._4_4_ + (int)CONCAT82(SUB148(auVar9 << 0x40,6),(short)(uVar2 >> 0x10)) +
                    auVar6._8_4_ + auVar7._8_4_ + ((uint)uVar3 & 0xffff) + (uint)(ushort)uVar2 + 4
                    >> 3);
  auVar14 = pshuflw(auVar14,auVar14,0);
  uVar13 = auVar14._0_4_;
  iVar11 = 0;
  do {
    lVar12 = 0;
    do {
      puVar1 = dst + lVar12;
      *(undefined4 *)puVar1 = uVar13;
      *(undefined4 *)(puVar1 + 2) = uVar13;
      *(undefined4 *)(puVar1 + 4) = uVar13;
      *(undefined4 *)(puVar1 + 6) = uVar13;
      lVar12 = lVar12 + 8;
    } while (lVar12 != 0x20);
    iVar11 = iVar11 + 1;
    dst = dst + stride;
  } while (iVar11 != 8);
  return;
}

Assistant:

static inline void highbd_dc_left_predictor(uint16_t *dst, ptrdiff_t stride,
                                            int bw, int bh,
                                            const uint16_t *above,
                                            const uint16_t *left, int bd) {
  int i, r, expected_dc, sum = 0;
  (void)above;
  (void)bd;

  for (i = 0; i < bh; i++) sum += left[i];
  expected_dc = (sum + (bh >> 1)) / bh;

  for (r = 0; r < bh; r++) {
    aom_memset16(dst, expected_dc, bw);
    dst += stride;
  }
}